

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::InternalSwap(UntypedMapBase *this,UntypedMapBase *other)

{
  UntypedMapBase *other_local;
  UntypedMapBase *this_local;
  
  std::swap<unsigned_int>(&this->num_elements_,&other->num_elements_);
  std::swap<unsigned_int>(&this->num_buckets_,&other->num_buckets_);
  std::swap<unsigned_int>(&this->seed_,&other->seed_);
  std::swap<unsigned_int>(&this->index_of_first_non_null_,&other->index_of_first_non_null_);
  std::swap<google::protobuf::internal::TableEntryPtr*>(&this->table_,&other->table_);
  std::swap<google::protobuf::internal::MapAllocator<void*>>(&this->alloc_,&other->alloc_);
  return;
}

Assistant:

void InternalSwap(UntypedMapBase* other) {
    std::swap(num_elements_, other->num_elements_);
    std::swap(num_buckets_, other->num_buckets_);
    std::swap(seed_, other->seed_);
    std::swap(index_of_first_non_null_, other->index_of_first_non_null_);
    std::swap(table_, other->table_);
    std::swap(alloc_, other->alloc_);
  }